

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O1

int Cfnan(float *val)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)((long)val + 2) & 0x7f80;
  if (uVar1 == 0) {
    *val = 0.0;
  }
  return (int)(uVar1 == 0x7f80 || uVar1 == 0);
}

Assistant:

int Cfnan( float *val )
{
   int code;

#if BYTESWAPPED
   short *sptr = (short*)val + 1;
#else
   short *sptr = (short*)val;
#endif

   code = fnan(*sptr);
   if( code==2 ) *val = 0.0;   /* Underflow */

   return( code!=0 );
}